

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

bool __thiscall libebml::EbmlMaster::CheckMandatory(EbmlMaster *this)

{
  bool bVar1;
  EbmlElement *pEVar2;
  EbmlSemanticContext *pEVar3;
  uint uVar4;
  ulong uVar5;
  
  pEVar3 = this->Context;
  if (pEVar3->Size == 0) {
    __assert_fail("Context.GetSize() != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                  ,0xc9,"bool libebml::EbmlMaster::CheckMandatory() const");
  }
  uVar4 = 1;
  uVar5 = 0;
  do {
    if (pEVar3->MyTable[uVar5].Mandatory == true) {
      pEVar2 = FindElt(this,pEVar3->MyTable[uVar5].GetCallbacks);
      pEVar3 = this->Context;
      if (pEVar2 == (EbmlElement *)0x0) {
        pEVar2 = (*(pEVar3->MyTable[uVar5].GetCallbacks)->Create)();
        bVar1 = pEVar2->DefaultIsSet;
        (*pEVar2->_vptr_EbmlElement[1])(pEVar2);
        if (bVar1 != true) {
          return false;
        }
        pEVar3 = this->Context;
      }
    }
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar5 < pEVar3->Size);
  return true;
}

Assistant:

bool EbmlMaster::CheckMandatory() const
{
  assert(Context.GetSize() != 0);

  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory()) {
      if (FindElt(EBML_CTX_IDX_INFO(Context,EltIdx)) == NULL) {
        EbmlElement *testElement = &EBML_CTX_IDX(Context,EltIdx).Create();
        bool hasDefaultValue     = testElement->DefaultISset();
        delete testElement;

#if defined(LIBEBML_DEBUG)
        // you are missing this Mandatory element
//         const char * MissingName = EBML_INFO_NAME(EBML_CTX_IDX_INFO(Context,EltIdx));
#endif // LIBEBML_DEBUG
        if (!hasDefaultValue)
          return false;
      }
    }
  }

  return true;
}